

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.H
# Opt level: O3

MultiFab * __thiscall
amrex::cast<amrex::MultiFab,amrex::iMultiFab>
          (MultiFab *__return_storage_ptr__,amrex *this,iMultiFab *mf_in)

{
  int iVar1;
  undefined1 auVar2 [16];
  double *pdVar3;
  int *piVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  MFIter mfi;
  Box local_b8;
  undefined1 local_98 [16];
  undefined1 auStack_88 [16];
  int aiStack_78 [2];
  int local_70;
  Vector<int,_std::allocator<int>_> *local_60;
  Vector<int,_std::allocator<int>_> *local_58;
  FabFactory<amrex::FArrayBox> local_38;
  
  local_b8.smallend.vect._0_8_ = *(undefined8 *)(this + 0xc0);
  local_b8.smallend.vect[2] = *(int *)(this + 200);
  local_98._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  stack0xffffffffffffff70 = (undefined1  [16])0x0;
  stack0xffffffffffffff80 = (undefined1  [16])0x0;
  local_38._vptr_FabFactory = (_func_int **)&PTR__FabFactory_00712918;
  MultiFab::MultiFab(__return_storage_ptr__,(BoxArray *)(this + 8),
                     (DistributionMapping *)(this + 0x70),*(int *)(this + 0xcc),&local_b8.smallend,
                     (MFInfo *)local_98,&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_88);
  MFIter::MFIter((MFIter *)local_98,(FabArrayBase *)this,'\0');
  if (aiStack_78[0] < local_70) {
    do {
      FabArrayBase::fabbox
                (&local_b8,(FabArrayBase *)local_98._8_8_,
                 (local_60->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[aiStack_78[0]]);
      piVar4 = aiStack_78;
      if (local_58 != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar4 = (local_58->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + aiStack_78[0];
      }
      iVar10 = local_b8.bigend.vect[0] - local_b8.smallend.vect[0];
      iVar6 = local_b8.bigend.vect[1] - local_b8.smallend.vect[1];
      iVar8 = local_b8.bigend.vect[2] - local_b8.smallend.vect[2];
      iVar1 = *(int *)(this + 0xcc);
      pdVar3 = BaseFab<double>::dataPtr
                         (&(__return_storage_ptr__->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                           super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[*piVar4]->super_BaseFab<double>
                          ,0);
      piVar4 = aiStack_78;
      if (local_58 != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar4 = (local_58->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + aiStack_78[0];
      }
      lVar11 = (long)(iVar10 + 1);
      lVar7 = (long)(iVar6 + 1);
      lVar9 = (long)(iVar8 + 1);
      piVar4 = BaseFab<int>::dataPtr
                         (*(BaseFab<int> **)(*(long *)(this + 0x108) + (long)*piVar4 * 8),0);
      auVar2 = _DAT_0065b9b0;
      if (0 < lVar9 * iVar1 * lVar7 * lVar11) {
        lVar9 = lVar11 * lVar9 * iVar1 * lVar7;
        lVar7 = lVar9 + -1;
        auVar12._8_4_ = (int)lVar7;
        auVar12._0_8_ = lVar7;
        auVar12._12_4_ = (int)((ulong)lVar7 >> 0x20);
        auVar12 = auVar12 ^ _DAT_0065b9b0;
        uVar5 = 0;
        auVar13 = _DAT_0065b9a0;
        do {
          auVar14 = auVar13 ^ auVar2;
          if ((bool)(~(auVar12._4_4_ < auVar14._4_4_ ||
                      auVar12._0_4_ < auVar14._0_4_ && auVar14._4_4_ == auVar12._4_4_) & 1)) {
            pdVar3[uVar5] = (double)piVar4[uVar5];
          }
          if (auVar14._12_4_ <= auVar12._12_4_ &&
              (auVar14._8_4_ <= auVar12._8_4_ || auVar14._12_4_ != auVar12._12_4_)) {
            pdVar3[uVar5 + 1] = (double)piVar4[uVar5 + 1];
          }
          uVar5 = uVar5 + 2;
          lVar7 = auVar13._8_8_;
          auVar13._0_8_ = auVar13._0_8_ + 2;
          auVar13._8_8_ = lVar7 + 2;
        } while ((lVar9 + 1U & 0xfffffffffffffffe) != uVar5);
      }
      MFIter::operator++((MFIter *)local_98);
    } while (aiStack_78[0] < local_70);
  }
  MFIter::~MFIter((MFIter *)local_98);
  return __return_storage_ptr__;
}

Assistant:

T cast (U const& mf_in)
    {
        T mf_out(mf_in.boxArray(), mf_in.DistributionMap(), mf_in.nComp(), mf_in.nGrowVect());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(mf_in); mfi.isValid(); ++mfi)
        {
            const Long n = mfi.fabbox().numPts() * mf_in.nComp();
            auto pdst = mf_out[mfi].dataPtr();
            auto psrc = mf_in [mfi].dataPtr();
            AMREX_HOST_DEVICE_PARALLEL_FOR_1D ( n, i,
            {
                pdst[i] = static_cast<typename U::value_type>(psrc[i]);
            });
        }
        return mf_out;
    }